

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall
duckdb_re2::Prog::DumpByteMap_abi_cxx11_(string *__return_storage_ptr__,Prog *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 in_R9;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string local_50;
  
  paVar7 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    iVar4 = (int)uVar5;
    uVar3 = 0xff;
    if (0xff < iVar4) {
      uVar3 = uVar5;
    }
    uVar6 = iVar4 - 1;
    lVar2 = (long)iVar4;
    do {
      if (0xfe < lVar2) {
        uVar6 = (uint)uVar3;
        break;
      }
      uVar6 = uVar6 + 1;
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (this->bytemap_[lVar1] == this->bytemap_[iVar4]);
    StringPrintf_abi_cxx11_
              (&local_50,"[%02x-%02x] -> %d\n",uVar5,(ulong)uVar6,(ulong)this->bytemap_[iVar4],in_R9
               ,paVar7);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar5 = (ulong)(uVar6 + 1);
    if (0xfe < (int)uVar6) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Prog::DumpByteMap() {
  std::string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    map += StringPrintf("[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}